

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

bool __thiscall ExecutorX86::AddBreakpoint(ExecutorX86 *this,uint instruction,bool oneHit)

{
  uint uVar1;
  uchar **ppuVar2;
  Breakpoint *pBVar3;
  Breakpoint *pBVar4;
  Breakpoint BVar5;
  undefined8 in_RAX;
  uint uVar6;
  ulong uVar7;
  Breakpoint local_28;
  
  uVar1 = (this->instAddress).count;
  if ((instruction <= uVar1) && (instruction < uVar1)) {
    ppuVar2 = (this->instAddress).data;
    uVar7 = (ulong)instruction;
    do {
      if (ppuVar2[uVar7] != (uchar *)0x0) {
        uVar6 = (uint)uVar7;
        local_28.oldOpcode = *ppuVar2[uVar7 & 0xffffffff];
        local_28.instIndex = uVar6;
        local_28._6_2_ = SUB82((ulong)in_RAX >> 0x30,0);
        local_28.oneHit = oneHit;
        BVar5 = local_28;
        uVar1 = (this->breakInstructions).count;
        if (uVar1 == (this->breakInstructions).max) {
          FastVector<ExecutorX86::Breakpoint,_false,_false>::grow_and_add
                    (&this->breakInstructions,uVar1,&local_28);
        }
        else {
          pBVar3 = (this->breakInstructions).data;
          (this->breakInstructions).count = uVar1 + 1;
          pBVar4 = pBVar3 + uVar1;
          pBVar4->oldOpcode = local_28.oldOpcode;
          pBVar4->oneHit = local_28.oneHit;
          pBVar3[uVar1].instIndex = uVar6;
          local_28 = BVar5;
        }
        if (uVar6 < (this->instAddress).count) {
          *(this->instAddress).data[uVar7 & 0xffffffff] = 0xcc;
          return true;
        }
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
  this->execErrorMessage = this->execErrorBuffer;
  return false;
}

Assistant:

bool ExecutorX86::AddBreakpoint(unsigned int instruction, bool oneHit)
{
	if(instruction > instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	while(instruction < instAddress.size() && !instAddress[instruction])
		instruction++;

	if(instruction >= instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	breakInstructions.push_back(Breakpoint(instruction, *instAddress[instruction], oneHit));
	*instAddress[instruction] = 0xcc;
	return true;
}